

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmFormatter::buffer_rendered(CVmFormatter *this,wchar_t c,uchar flags,int wid)

{
  undefined4 uVar1;
  byte bVar2;
  vmcon_color_t *pvVar3;
  uchar flags_before;
  int wid_local;
  uchar flags_local;
  wchar_t c_local;
  CVmFormatter *this_local;
  
  wid_local = wid;
  if (this->linepos_ < 1) {
    bVar2 = 0;
  }
  else {
    bVar2 = this->flagbuf_[this->linepos_ + -1] & 1;
  }
  for (; wid_local != 0; wid_local = wid_local + -1) {
    this->linebuf_[this->linepos_] = c;
    this->flagbuf_[this->linepos_] = flags;
    pvVar3 = this->colorbuf_ + this->linepos_;
    pvVar3->fg = (this->cur_color_).fg;
    pvVar3->bg = (this->cur_color_).bg;
    uVar1 = *(undefined4 *)&(this->cur_color_).field_0x14;
    pvVar3->attr = (this->cur_color_).attr;
    *(undefined4 *)&pvVar3->field_0x14 = uVar1;
    if (1 < wid_local) {
      this->flagbuf_[this->linepos_] = this->flagbuf_[this->linepos_] | bVar2;
    }
    this->linepos_ = this->linepos_ + 1;
    this->linecol_ = this->linecol_ + 1;
  }
  return;
}

Assistant:

void CVmFormatter::buffer_rendered(wchar_t c, unsigned char flags, int wid)
{
    unsigned char flags_before;

    /* note whether or not we have a break before us */
    flags_before = (linepos_ > 0
                    ? flagbuf_[linepos_-1] & VMCON_OBF_NOBREAK
                    : 0);

    /* add the character the given number of times */
    for ( ; wid != 0 ; --wid)
    {
        /* buffer the character */
        linebuf_[linepos_] = c;
        flagbuf_[linepos_] = flags;
        colorbuf_[linepos_] = cur_color_;

        /* 
         *   if this isn't the last part of the character, carry forward any
         *   no-break flag from the previous part of the character; this will
         *   ensure that a no-break to the left of the sequence applies to
         *   the entire sequence 
         */
        if (wid > 1)
            flagbuf_[linepos_] |= flags_before;

        /* advance one character in the buffer */
        ++linepos_;

        /* adjust our column counter */
        ++linecol_;
    }
}